

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O3

bool __thiscall
slang::analysis::DataFlowAnalysis::isReferenced
          (DataFlowAnalysis *this,ValueSymbol *symbol,Expression *lsp)

{
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  Type *rootType;
  ulong uVar7;
  long lVar8;
  value_type *elements_1;
  IntervalMap<unsigned_long,_std::monostate,_3U> *this_00;
  ulong uVar9;
  uint uVar10;
  SymbolLSPMap *this_01;
  uint uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char cVar15;
  char cVar16;
  char cVar17;
  byte bVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  byte bVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  byte bVar30;
  optional<std::pair<unsigned_long,_unsigned_long>_> bounds;
  _Storage<std::pair<unsigned_long,_unsigned_long>,_true> local_110;
  char local_100;
  char local_f8;
  char cStack_f7;
  char cStack_f6;
  byte bStack_f5;
  char cStack_f4;
  char cStack_f3;
  char cStack_f2;
  byte bStack_f1;
  char cStack_f0;
  char cStack_ef;
  char cStack_ee;
  byte bStack_ed;
  char cStack_ec;
  char cStack_eb;
  char cStack_ea;
  byte bStack_e9;
  char local_e8;
  char cStack_e7;
  char cStack_e6;
  byte bStack_e5;
  char cStack_e4;
  char cStack_e3;
  char cStack_e2;
  byte bStack_e1;
  char cStack_e0;
  char cStack_df;
  char cStack_de;
  byte bStack_dd;
  char cStack_dc;
  char cStack_db;
  char cStack_da;
  byte bStack_d9;
  char local_d8;
  char cStack_d7;
  char cStack_d6;
  byte bStack_d5;
  char cStack_d4;
  char cStack_d3;
  char cStack_d2;
  byte bStack_d1;
  char cStack_d0;
  char cStack_cf;
  char cStack_ce;
  byte bStack_cd;
  char cStack_cc;
  char cStack_cb;
  char cStack_ca;
  byte bStack_c9;
  const_iterator local_c0;
  overlap_iterator local_80;
  
  rootType = ast::DeclaredType::getType(&symbol->declaredType);
  ast::ValueDriver::getBounds
            ((optional<std::pair<unsigned_long,_unsigned_long>_> *)&local_110._M_value,lsp,
             &(this->
              super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
              ).super_FlowAnalysisBase.evalContext,rootType);
  if (local_100 == '\0') {
    bVar6 = isReferenced(this,symbol);
  }
  else {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = symbol;
    uVar12 = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar7 = uVar12 >> ((this->symbolToSlot).field_0x50 & 0x3f);
    lVar8 = (uVar12 & 0xff) * 4;
    cVar15 = *(char *)(&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::
                        match_word(unsigned_long)::word + (uVar12 & 0xff));
    cVar16 = *(char *)((long)&boost::unordered::detail::foa::
                              group15<boost::unordered::detail::foa::plain_integral>::
                              match_word(unsigned_long)::word + lVar8 + 1);
    cVar17 = *(char *)((long)&boost::unordered::detail::foa::
                              group15<boost::unordered::detail::foa::plain_integral>::
                              match_word(unsigned_long)::word + lVar8 + 2);
    bVar18 = *(byte *)((long)&boost::unordered::detail::foa::
                              group15<boost::unordered::detail::foa::plain_integral>::
                              match_word(unsigned_long)::word + lVar8 + 3);
    uVar11 = (uint)uVar12 & 7;
    uVar2 = *(ulong *)&(this->symbolToSlot).field_0x58;
    uVar9 = 0;
    do {
      pcVar1 = (char *)(*(long *)&(this->symbolToSlot).field_0x60 + uVar7 * 0x10);
      local_d8 = *pcVar1;
      cStack_d7 = pcVar1[1];
      cStack_d6 = pcVar1[2];
      bStack_d5 = pcVar1[3];
      cStack_d4 = pcVar1[4];
      cStack_d3 = pcVar1[5];
      cStack_d2 = pcVar1[6];
      bStack_d1 = pcVar1[7];
      cStack_d0 = pcVar1[8];
      cStack_cf = pcVar1[9];
      cStack_ce = pcVar1[10];
      bStack_cd = pcVar1[0xb];
      cStack_cc = pcVar1[0xc];
      cStack_cb = pcVar1[0xd];
      cStack_ca = pcVar1[0xe];
      bStack_c9 = pcVar1[0xf];
      auVar13[0] = -(local_d8 == cVar15);
      auVar13[1] = -(cStack_d7 == cVar16);
      auVar13[2] = -(cStack_d6 == cVar17);
      auVar13[3] = -(bStack_d5 == bVar18);
      auVar13[4] = -(cStack_d4 == cVar15);
      auVar13[5] = -(cStack_d3 == cVar16);
      auVar13[6] = -(cStack_d2 == cVar17);
      auVar13[7] = -(bStack_d1 == bVar18);
      auVar13[8] = -(cStack_d0 == cVar15);
      auVar13[9] = -(cStack_cf == cVar16);
      auVar13[10] = -(cStack_ce == cVar17);
      auVar13[0xb] = -(bStack_cd == bVar18);
      auVar13[0xc] = -(cStack_cc == cVar15);
      auVar13[0xd] = -(cStack_cb == cVar16);
      auVar13[0xe] = -(cStack_ca == cVar17);
      auVar13[0xf] = -(bStack_c9 == bVar18);
      uVar10 = (uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe);
      if (uVar10 != 0) {
        lVar8 = *(long *)&(this->symbolToSlot).field_0x68 + uVar7 * 0xf0;
        do {
          iVar3 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
            }
          }
          if (*(ValueSymbol **)(lVar8 + (ulong)(uint)(iVar3 << 4)) == symbol) {
            this_01 = &(this->lvalues).
                       super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.data_
                       [*(uint *)(lVar8 + (ulong)(uint)(iVar3 << 4) + 8)].assigned;
            local_f8 = cVar15;
            cStack_f7 = cVar16;
            cStack_f6 = cVar17;
            bStack_f5 = bVar18;
            cStack_f4 = cVar15;
            cStack_f3 = cVar16;
            cStack_f2 = cVar17;
            bStack_f1 = bVar18;
            cStack_f0 = cVar15;
            cStack_ef = cVar16;
            cStack_ee = cVar17;
            bStack_ed = bVar18;
            cStack_ec = cVar15;
            cStack_eb = cVar16;
            cStack_ea = cVar17;
            bStack_e9 = bVar18;
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::find
                      (&local_80,this_01,local_110._M_value.first,local_110._M_value.second);
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::end(&local_c0,this_01);
            bVar6 = IntervalMapDetails::Path::operator==
                              (&local_80.super_iterator.super_const_iterator.path,&local_c0.path);
            if (local_c0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                data_ != (pointer)local_c0.path.path.
                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                  firstElement) {
              operator_delete(local_c0.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
            }
            if (local_80.super_iterator.super_const_iterator.path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
                (pointer)((long)&local_80.super_iterator.super_const_iterator.path.path.
                                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry> +
                         0x18U)) {
              operator_delete(local_80.super_iterator.super_const_iterator.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
            }
            cVar15 = local_f8;
            cVar16 = cStack_f7;
            cVar17 = cStack_f6;
            bVar18 = bStack_f5;
            cVar19 = cStack_f4;
            cVar20 = cStack_f3;
            cVar21 = cStack_f2;
            bVar22 = bStack_f1;
            cVar23 = cStack_f0;
            cVar24 = cStack_ef;
            cVar25 = cStack_ee;
            bVar26 = bStack_ed;
            cVar27 = cStack_ec;
            cVar28 = cStack_eb;
            cVar29 = cStack_ea;
            bVar30 = bStack_e9;
            if (!bVar6) {
              return true;
            }
            goto LAB_003860fa;
          }
          uVar10 = uVar10 - 1 & uVar10;
        } while (uVar10 != 0);
      }
      cVar19 = cVar15;
      cVar20 = cVar16;
      cVar21 = cVar17;
      bVar22 = bVar18;
      cVar23 = cVar15;
      cVar24 = cVar16;
      cVar25 = cVar17;
      bVar26 = bVar18;
      cVar27 = cVar15;
      cVar28 = cVar16;
      cVar29 = cVar17;
      bVar30 = bVar18;
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar11] & bStack_c9) == 0) break;
      lVar8 = uVar7 + uVar9;
      uVar9 = uVar9 + 1;
      uVar7 = lVar8 + 1U & uVar2;
    } while (uVar9 <= uVar2);
LAB_003860fa:
    uVar12 = uVar12 >> ((this->rvalues).field_0x130 & 0x3f);
    uVar2 = *(ulong *)&(this->rvalues).field_0x138;
    uVar7 = 0;
    bVar6 = false;
    do {
      pcVar1 = (char *)(*(long *)&(this->rvalues).field_0x140 + uVar12 * 0x10);
      local_e8 = *pcVar1;
      cStack_e7 = pcVar1[1];
      cStack_e6 = pcVar1[2];
      bStack_e5 = pcVar1[3];
      cStack_e4 = pcVar1[4];
      cStack_e3 = pcVar1[5];
      cStack_e2 = pcVar1[6];
      bStack_e1 = pcVar1[7];
      cStack_e0 = pcVar1[8];
      cStack_df = pcVar1[9];
      cStack_de = pcVar1[10];
      bStack_dd = pcVar1[0xb];
      cStack_dc = pcVar1[0xc];
      cStack_db = pcVar1[0xd];
      cStack_da = pcVar1[0xe];
      bStack_d9 = pcVar1[0xf];
      auVar14[0] = -(local_e8 == cVar15);
      auVar14[1] = -(cStack_e7 == cVar16);
      auVar14[2] = -(cStack_e6 == cVar17);
      auVar14[3] = -(bStack_e5 == bVar18);
      auVar14[4] = -(cStack_e4 == cVar19);
      auVar14[5] = -(cStack_e3 == cVar20);
      auVar14[6] = -(cStack_e2 == cVar21);
      auVar14[7] = -(bStack_e1 == bVar22);
      auVar14[8] = -(cStack_e0 == cVar23);
      auVar14[9] = -(cStack_df == cVar24);
      auVar14[10] = -(cStack_de == cVar25);
      auVar14[0xb] = -(bStack_dd == bVar26);
      auVar14[0xc] = -(cStack_dc == cVar27);
      auVar14[0xd] = -(cStack_db == cVar28);
      auVar14[0xe] = -(cStack_da == cVar29);
      auVar14[0xf] = -(bStack_d9 == bVar30);
      uVar10 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
      if (uVar10 != 0) {
        lVar8 = *(long *)&(this->rvalues).field_0x148 + uVar12 * 0x438;
        do {
          uVar4 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
            }
          }
          if (*(ValueSymbol **)(lVar8 + (ulong)uVar4 * 0x48) == symbol) {
            this_00 = (IntervalMap<unsigned_long,_std::monostate,_3U> *)
                      (lVar8 + (ulong)uVar4 * 0x48 + 8);
            IntervalMap<unsigned_long,_std::monostate,_3U>::find
                      ((overlap_iterator *)&local_80,this_00,local_110._M_value.first,
                       local_110._M_value.second);
            IntervalMap<unsigned_long,_std::monostate,_3U>::end((const_iterator *)&local_c0,this_00)
            ;
            bVar6 = IntervalMapDetails::Path::operator==
                              (&local_80.super_iterator.super_const_iterator.path,&local_c0.path);
            if (local_c0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                data_ != (pointer)local_c0.path.path.
                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                  firstElement) {
              operator_delete(local_c0.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
            }
            if (local_80.super_iterator.super_const_iterator.path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
                (pointer)((long)&local_80.super_iterator.super_const_iterator.path.path.
                                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry> +
                         0x18U)) {
              operator_delete(local_80.super_iterator.super_const_iterator.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
            }
            return !bVar6;
          }
          uVar10 = uVar10 - 1 & uVar10;
        } while (uVar10 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar11] & bStack_d9) == 0) {
        return false;
      }
      lVar8 = uVar12 + uVar7;
      uVar7 = uVar7 + 1;
      uVar12 = lVar8 + 1U & uVar2;
    } while (uVar7 <= uVar2);
  }
  return bVar6;
}

Assistant:

bool DataFlowAnalysis::isReferenced(const ValueSymbol& symbol, const Expression& lsp) const {
    auto bounds = ValueDriver::getBounds(lsp, getEvalContext(), symbol.getType());
    if (!bounds)
        return isReferenced(symbol);

    {
        auto it = symbolToSlot.find(&symbol);
        if (it != symbolToSlot.end()) {
            auto& symbolState = lvalues[it->second];
            if (symbolState.assigned.find(*bounds) != symbolState.assigned.end())
                return true;
        }
    }
    {
        auto it = rvalues.find(&symbol);
        if (it != rvalues.end() && it->second.find(*bounds) != it->second.end())
            return true;
    }

    return false;
}